

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemView::dragMoveEvent(QAbstractItemView *this,QDragMoveEvent *event)

{
  QRect *pQVar1;
  QAbstractItemViewPrivate *this_00;
  long lVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  LayoutDirection LVar6;
  int iVar7;
  DragDropMode DVar8;
  DropIndicatorPosition DVar9;
  QAbstractItemView *pQVar10;
  QWidget *pQVar11;
  ulong uVar12;
  undefined8 uVar13;
  QPoint QVar14;
  long in_FS_OFFSET;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  QModelIndex local_80;
  Representation local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  dVar16 = (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(event + 0x10);
  bVar5 = 2147483647.0 < dVar16;
  if (dVar16 <= -2147483648.0) {
    dVar16 = -2147483648.0;
  }
  dVar15 = (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(event + 0x18);
  bVar3 = 2147483647.0 < dVar15;
  if (dVar15 <= -2147483648.0) {
    dVar15 = -2147483648.0;
  }
  pQVar11 = *(QWidget **)
             &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  LVar6 = QWidget::layoutDirection(pQVar11);
  iVar7 = (**(code **)(*(long *)pQVar11 + 0x2b0))(pQVar11);
  iVar4 = -iVar7;
  if (LVar6 != RightToLeft) {
    iVar4 = iVar7;
  }
  iVar7 = (**(code **)(*(long *)pQVar11 + 0x2b8))(pQVar11);
  QVar14.xp.m_i =
       iVar4 + (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar16);
  QVar14.yp.m_i =
       iVar7 + (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar15);
  this_00->draggedPosition = QVar14;
  DVar8 = dragDropMode(this);
  if ((DVar8 == InternalMove) &&
     ((pQVar10 = (QAbstractItemView *)QDropEvent::source(), pQVar10 != this ||
      (((byte)event[0x28] & 2) == 0)))) goto LAB_00534520;
  event[0xc] = (QDragMoveEvent)0x0;
  local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  dVar16 = (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(event + 0x10);
  bVar5 = 2147483647.0 < dVar16;
  if (dVar16 <= -2147483648.0) {
    dVar16 = -2147483648.0;
  }
  local_80.r = (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar16);
  dVar16 = (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(event + 0x18);
  bVar5 = 2147483647.0 < dVar16;
  if (dVar16 <= -2147483648.0) {
    dVar16 = -2147483648.0;
  }
  local_80.c = (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar16);
  (**(code **)(*(long *)this + 0x1f0))(&local_58,this);
  QPersistentModelIndex::operator=(&this_00->hover,&local_58);
  bVar5 = QAbstractItemViewPrivate::droppingOnItself(this_00,(QDropEvent *)event,&local_58);
  if ((!bVar5) && (bVar5 = QAbstractItemViewPrivate::canDrop(this_00,(QDropEvent *)event), bVar5)) {
    if ((local_58.r < 0) ||
       ((((long)local_58._0_8_ < 0 || (local_58.m.ptr == (QAbstractItemModel *)0x0)) ||
        (this_00->showDropIndicator != true)))) {
      (this_00->dropIndicatorRect).x1 = 0;
      (this_00->dropIndicatorRect).y1 = 0;
      (this_00->dropIndicatorRect).x2 = -1;
      (this_00->dropIndicatorRect).y2 = -1;
      this_00->dropIndicatorPosition = OnViewport;
LAB_005343fd:
      QPersistentModelIndex::operator_cast_to_QModelIndex
                (&local_80,(QPersistentModelIndex *)(*(long *)(this + 8) + 0x3b8));
      uVar12 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_80);
      if ((uVar12 & 8) != 0) {
LAB_0053442a:
        *(undefined4 *)(event + 0x2c) = *(undefined4 *)(event + 0x30);
        event[0xc] = (QDragMoveEvent)0x1;
      }
    }
    else {
      auVar17 = (**(code **)(*(long *)this + 0x1e0))(this,&local_58);
      local_68.m_i = auVar17._0_4_;
      iStack_64 = auVar17._4_4_;
      iStack_60 = auVar17._8_4_;
      iStack_5c = auVar17._12_4_;
      dVar16 = (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000)
               + *(double *)(event + 0x10);
      bVar5 = 2147483647.0 < dVar16;
      if (dVar16 <= -2147483648.0) {
        dVar16 = -2147483648.0;
      }
      local_80.r = (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar16
                                );
      dVar16 = (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000)
               + *(double *)(event + 0x18);
      bVar5 = 2147483647.0 < dVar16;
      if (dVar16 <= -2147483648.0) {
        dVar16 = -2147483648.0;
      }
      local_80.c = (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar16
                                );
      DVar9 = (**(code **)(*(long *)&(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate
                                     .super_QWidgetPrivate + 0x120))
                        (this_00,&local_80,&local_68,&local_58);
      this_00->dropIndicatorPosition = DVar9;
      if (this_00->selectionBehavior == SelectRows) {
        if ((DVar9 != OnViewport) &&
           ((DVar9 != OnItem ||
            (pQVar10 = (QAbstractItemView *)QDropEvent::source(), pQVar10 == this)))) {
          if (0 < local_58.c) {
            QModelIndex::siblingAtColumn(&local_80,&local_58,0);
            auVar17 = (**(code **)(*(long *)this + 0x1e0))(this,&local_80);
            local_68.m_i = auVar17._0_4_;
            iStack_64 = auVar17._4_4_;
            iStack_60 = auVar17._8_4_;
            iStack_5c = auVar17._12_4_;
          }
          pQVar11 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
          iStack_60 = ~(pQVar11->data->crect).x1.m_i + (pQVar11->data->crect).x2.m_i;
        }
        DVar9 = this_00->dropIndicatorPosition;
      }
      switch(DVar9) {
      case OnItem:
        uVar12 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_58);
        pQVar1 = &this_00->dropIndicatorRect;
        if ((uVar12 & 8) != 0) {
          pQVar1->x1 = (Representation)local_68.m_i;
          pQVar1->y1 = (Representation)iStack_64;
          (this_00->dropIndicatorRect).x2 = (Representation)iStack_60;
          (this_00->dropIndicatorRect).y2 = (Representation)iStack_5c;
          goto LAB_0053442a;
        }
        pQVar1->x1 = 0;
        pQVar1->y1 = 0;
        (this_00->dropIndicatorRect).x2 = -1;
        (this_00->dropIndicatorRect).y2 = -1;
        break;
      case AboveItem:
        if (local_58.m.ptr == (QAbstractItemModel *)0x0) {
          local_80.r = -1;
          local_80.c = -1;
          local_80.i = 0;
          local_80.m.ptr = (QAbstractItemModel *)0x0;
        }
        else {
          (**(code **)(*(long *)local_58.m.ptr + 0x68))(&local_80,local_58.m.ptr,&local_58);
        }
        uVar12 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_80);
        if ((uVar12 & 8) != 0) {
          (this_00->dropIndicatorRect).x1.m_i = local_68.m_i;
          (this_00->dropIndicatorRect).y1 = (Representation)iStack_64;
          (this_00->dropIndicatorRect).x2 = (Representation)iStack_60;
          (this_00->dropIndicatorRect).y2.m_i = iStack_64 + -1;
          goto LAB_0053442a;
        }
LAB_00534627:
        (this_00->dropIndicatorRect).x1 = 0;
        (this_00->dropIndicatorRect).y1 = 0;
        (this_00->dropIndicatorRect).x2 = -1;
        (this_00->dropIndicatorRect).y2 = -1;
        break;
      case BelowItem:
        if (local_58.m.ptr == (QAbstractItemModel *)0x0) {
          local_80.r = -1;
          local_80.c = -1;
          local_80.i = 0;
          local_80.m.ptr = (QAbstractItemModel *)0x0;
        }
        else {
          (**(code **)(*(long *)local_58.m.ptr + 0x68))(&local_80,local_58.m.ptr,&local_58);
        }
        uVar12 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_80);
        if ((uVar12 & 8) == 0) goto LAB_00534627;
        (this_00->dropIndicatorRect).x1.m_i = local_68.m_i;
        (this_00->dropIndicatorRect).y1.m_i = iStack_5c;
        (this_00->dropIndicatorRect).x2.m_i = iStack_60;
        (this_00->dropIndicatorRect).y2.m_i = iStack_5c + -1;
        goto LAB_0053442a;
      case OnViewport:
        (this_00->dropIndicatorRect).x1 = 0;
        (this_00->dropIndicatorRect).y1 = 0;
        (this_00->dropIndicatorRect).x2 = -1;
        (this_00->dropIndicatorRect).y2 = -1;
        goto LAB_005343fd;
      }
    }
    QWidget::update((this_00->super_QAbstractScrollAreaPrivate).viewport);
  }
  dVar16 = (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(event + 0x10);
  bVar5 = 2147483647.0 < dVar16;
  if (dVar16 <= -2147483648.0) {
    dVar16 = -2147483648.0;
  }
  local_80.r = (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar16);
  dVar16 = (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(event + 0x18);
  bVar5 = 2147483647.0 < dVar16;
  if (dVar16 <= -2147483648.0) {
    dVar16 = -2147483648.0;
  }
  local_80.c = (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar16);
  bVar5 = QAbstractItemViewPrivate::shouldAutoScroll(this_00,(QPoint *)&local_80);
  if (bVar5) {
    lVar2 = *(long *)(this + 8);
    uVar13 = 50000000;
    if (*(int *)(lVar2 + 0x458) == 0) {
      uVar13 = 150000000;
    }
    QBasicTimer::start(lVar2 + 0x41c,uVar13,1,*(undefined8 *)(lVar2 + 8));
    *(undefined4 *)(lVar2 + 0x424) = 0;
  }
LAB_00534520:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::dragMoveEvent(QDragMoveEvent *event)
{
    Q_D(QAbstractItemView);
    d->draggedPosition = event->position().toPoint() + d->offset();
    if (dragDropMode() == InternalMove
        && (event->source() != this || !(event->possibleActions() & Qt::MoveAction)))
        return;

    // ignore by default
    event->ignore();

    QModelIndex index = indexAt(event->position().toPoint());
    d->hover = index;
    if (!d->droppingOnItself(event, index)
        && d->canDrop(event)) {

        if (index.isValid() && d->showDropIndicator) {
            QRect rect = visualRect(index);
            d->dropIndicatorPosition = d->position(event->position().toPoint(), rect, index);
            if (d->selectionBehavior == QAbstractItemView::SelectRows
                && d->dropIndicatorPosition != OnViewport
                && (d->dropIndicatorPosition != OnItem || event->source() == this)) {
                if (index.column() > 0)
                    rect = visualRect(index.siblingAtColumn(0));
                rect.setWidth(viewport()->width() - 1 - rect.x());
            }
            switch (d->dropIndicatorPosition) {
            case AboveItem:
                if (d->isIndexDropEnabled(index.parent())) {
                    d->dropIndicatorRect = QRect(rect.left(), rect.top(), rect.width(), 0);
                    event->acceptProposedAction();
                } else {
                    d->dropIndicatorRect = QRect();
                }
                break;
            case BelowItem:
                if (d->isIndexDropEnabled(index.parent())) {
                    d->dropIndicatorRect = QRect(rect.left(), rect.bottom(), rect.width(), 0);
                    event->acceptProposedAction();
                } else {
                    d->dropIndicatorRect = QRect();
                }
                break;
            case OnItem:
                if (d->isIndexDropEnabled(index)) {
                    d->dropIndicatorRect = rect;
                    event->acceptProposedAction();
                } else {
                    d->dropIndicatorRect = QRect();
                }
                break;
            case OnViewport:
                d->dropIndicatorRect = QRect();
                if (d->isIndexDropEnabled(rootIndex())) {
                    event->acceptProposedAction(); // allow dropping in empty areas
                }
                break;
            }
        } else {
            d->dropIndicatorRect = QRect();
            d->dropIndicatorPosition = OnViewport;
            if (d->isIndexDropEnabled(rootIndex())) {
                event->acceptProposedAction(); // allow dropping in empty areas
            }
        }
        d->viewport->update();
    } // can drop

    if (d->shouldAutoScroll(event->position().toPoint()))
        startAutoScroll();
}